

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O3

PropertyName Js::ParserWrapper::FunctionName(ParseNode *node)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeFnc *pPVar3;
  undefined4 *puVar4;
  ParseNodeVar *pPVar5;
  
  if (node->nop == knopFncDecl) {
    pPVar3 = ParseNode::AsParseNodeFnc(node);
    pPVar5 = pPVar3->pnodeName;
    if (pPVar5 != (ParseNodeVar *)0x0) {
      if ((pPVar5->super_ParseNode).nop != knopVarDecl) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                    ,0x5c,"(function->pnodeName->nop == knopVarDecl)",
                                    "function->pnodeName->nop == knopVarDecl");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pPVar5 = pPVar3->pnodeName;
      }
      return pPVar5->pid;
    }
  }
  return (PropertyName)0x0;
}

Assistant:

PropertyName ParserWrapper::FunctionName( ParseNode *node )
    {
        if( node->nop == knopFncDecl )
        {
            ParseNodeFnc * function = node->AsParseNodeFnc();
            if(function->pnodeName)
            {
                Assert(function->pnodeName->nop == knopVarDecl);
                return function->pnodeName->pid;
            }
        }
        return nullptr;
    }